

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskUtil.cpp
# Opt level: O0

set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_> *
ChecksumMethods(set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
                *__return_storage_ptr__,uint8_t *buf,int len)

{
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  pair<std::_Rb_tree_const_iterator<ChecksumType>,_bool> pVar4;
  value_type local_c4;
  _Base_ptr local_c0;
  undefined1 local_b8;
  value_type local_b0 [2];
  _Base_ptr local_a8;
  undefined1 local_a0;
  value_type local_98;
  uchar local_91;
  _Rb_tree_const_iterator<ChecksumType> _Stack_90;
  uint8_t xor_;
  undefined1 local_88;
  value_type local_80;
  uchar local_79;
  _Rb_tree_const_iterator<ChecksumType> _Stack_78;
  uint8_t sum;
  undefined1 local_70;
  value_type local_68;
  CRC16 local_62;
  _Rb_tree_const_iterator<ChecksumType> _Stack_60;
  CRC16 crc_1;
  value_type local_50;
  CRC16 local_4a;
  _Rb_tree_const_iterator<ChecksumType> _Stack_48;
  CRC16 crc;
  value_type local_28 [2];
  undefined1 local_1d;
  int local_1c;
  uint8_t *puStack_18;
  int len_local;
  uint8_t *buf_local;
  set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_> *methods;
  
  local_1d = 0;
  local_1c = len;
  puStack_18 = buf;
  buf_local = (uint8_t *)__return_storage_ptr__;
  std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>::set
            (__return_storage_ptr__);
  if (0x1800 < local_1c) {
    if (((0x1802 < local_1c) && (puStack_18[0x1800] == 0x8c)) && (puStack_18[0x1801] == '\x15')) {
      local_28[0] = Constant_8C15;
      pVar4 = std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>::insert
                        (__return_storage_ptr__,local_28);
      _Stack_48 = pVar4.first._M_node;
    }
    if (0x1801 < local_1c) {
      CRC16::CRC16(&local_4a,puStack_18,0x1802,0xd2f6);
      uVar2 = CRC16::operator_cast_to_unsigned_short(&local_4a);
      if (uVar2 == 0) {
        local_50 = CRC_D2F6_1800;
        pVar4 = std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>::
                insert(__return_storage_ptr__,&local_50);
        _Stack_60 = pVar4.first._M_node;
      }
    }
    if (0x1803 < local_1c) {
      CRC16::CRC16(&local_62,puStack_18,0x1804,0xd2f6);
      uVar2 = CRC16::operator_cast_to_unsigned_short(&local_62);
      if (uVar2 == 0) {
        local_68 = CRC_D2F6_1802;
        pVar4 = std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>::
                insert(__return_storage_ptr__,&local_68);
        _Stack_78 = pVar4.first._M_node;
        local_70 = pVar4.second;
      }
    }
    iVar3 = std::accumulate<unsigned_char_const*,int>(puStack_18,puStack_18 + 0x1800,0);
    local_79 = (uchar)iVar3;
    if (puStack_18[0x1800] == local_79) {
      local_80 = Sum_1800;
      pVar4 = std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>::insert
                        (__return_storage_ptr__,&local_80);
      _Stack_90 = pVar4.first._M_node;
      local_88 = pVar4.second;
    }
    iVar3 = std::accumulate<unsigned_char_const*,int,std::bit_xor<int>>
                      (puStack_18,puStack_18 + 0x1800,0);
    local_91 = (uchar)iVar3;
    if (puStack_18[0x1800] == local_91) {
      local_98 = XOR_1800;
      pVar4 = std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>::insert
                        (__return_storage_ptr__,&local_98);
      local_a8 = (_Base_ptr)pVar4.first._M_node;
      local_a0 = pVar4.second;
    }
    if ((0x189f < local_1c) &&
       (local_91 = std::accumulate<unsigned_char_const*,unsigned_char,std::bit_xor<unsigned_char>>
                             (puStack_18 + 0x1800,puStack_18 + 0x18a0,local_91),
       puStack_18[0x18a0] == local_91)) {
      local_b0[0] = XOR_18A0;
      pVar4 = std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>::insert
                        (__return_storage_ptr__,local_b0);
      local_c0 = (_Base_ptr)pVar4.first._M_node;
      local_b8 = pVar4.second;
    }
    bVar1 = std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>::empty
                      (__return_storage_ptr__);
    if ((bVar1) && (iVar3 = memcmp(puStack_18,puStack_18 + 1,0x17ff), iVar3 == 0)) {
      local_c4 = None;
      std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>::insert
                (__return_storage_ptr__,&local_c4);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<ChecksumType> ChecksumMethods(const uint8_t* buf, int len)
{
    std::set<ChecksumType> methods;

    // If there's not enough data, there can be no checksum. Return an empty set.
    if (len <= 0x1800)
        return methods;

    // 2-byte CRC
    {
        // Check for CRC of 8C 15, which seems to be a strange fixed checksum found on some disks.
        // This is known to be used by The Cycles (+3), Vigilante (CPC), and Les Hits de Noel (CPC).
        if (len >= 0x1803 && buf[0x1800] == 0x8c && buf[0x1801] == 0x15)
            methods.insert(ChecksumType::Constant_8C15);

        // Calculate the CRC-16 of the first 0x1800 bytes, using a custom CRC init of D2F6.
        // This is known to be used by JPP's Goal Busters (CPC).
        if (len >= 0x1802)
        {
            CRC16 crc(buf, 0x1800 + 2, 0xd2f6); // include CRC bytes
            if (!crc)
                methods.insert(ChecksumType::CRC_D2F6_1800);
        }

        // Calculate the CRC-16 of the first 0x1802 bytes, using a custom CRC init of D2F6.
        // This is known to be used by Les Fous du Foot (CPC).
        if (len >= 0x1804)
        {
            CRC16 crc(buf, 0x1802 + 2, 0xd2f6); // include CRC bytes
            if (!crc)
                methods.insert(ChecksumType::CRC_D2F6_1802);
        }
    }

    // 1-byte checksum
    {
        // Sum the first 6K
        auto sum = static_cast<uint8_t>(std::accumulate(buf, buf + 0x1800, 0));
        if (buf[0x1800] == sum)
            methods.insert(ChecksumType::Sum_1800);

        // XOR together the first 6K
        auto xor_ = static_cast<uint8_t>(
            std::accumulate(buf, buf + 0x1800, 0, std::bit_xor<int>()));
        if (buf[0x1800] == xor_)
            methods.insert(ChecksumType::XOR_1800);

        if (len >= 0x18a0)
        {
            // Extend the XOR to 0x18a0 bytes, as needed for Coin-Op Hits
            xor_ = static_cast<uint8_t>(
                std::accumulate(buf + 0x1800, buf + 0x18a0, xor_, std::bit_xor<uint8_t>()));
            if (buf[0x18a0] == xor_)
                methods.insert(ChecksumType::XOR_18A0);
        }
    }

    // Check 6K of filler on unused tracks (Vigilante on CPC)
    // This is only done if we haven't yet matched another method.
    if (methods.empty() && !memcmp(buf, buf + 1, 0x17ff))
        methods.insert(ChecksumType::None);

    return methods;
}